

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsFederate generateNewHelicsFederateObject(shared_ptr<helics::Federate> *fed,FederateType type)

{
  _Head_base<0UL,_helics::FedObject_*,_false> _Var1;
  __single_object fedI;
  _Head_base<0UL,_helics::FedObject_*,_false> local_38;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> local_30;
  MasterObjectHolder *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_unique<helics::FedObject>();
  std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_38._M_head_impl)->fedptr).
              super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>,
             &fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_head_impl = local_38._M_head_impl;
  (local_38._M_head_impl)->type = type;
  (local_38._M_head_impl)->valid = 0x2352188;
  getMasterHolder();
  local_30._M_t.super___uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>.
  _M_t.super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>.
  super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl =
       (__uniq_ptr_data<helics::FedObject,_std::default_delete<helics::FedObject>,_true,_true>)
       (__uniq_ptr_data<helics::FedObject,_std::default_delete<helics::FedObject>,_true,_true>)
       local_38._M_head_impl;
  local_38._M_head_impl = (FedObject *)0x0;
  MasterObjectHolder::addFed(local_28,&local_30);
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr
            (&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr
            ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)&local_38);
  return _Var1._M_head_impl;
}

Assistant:

HelicsFederate generateNewHelicsFederateObject(std::shared_ptr<helics::Federate> fed, helics::FederateType type)
{
    auto fedI = std::make_unique<helics::FedObject>();
    fedI->fedptr = std::move(fed);
    fedI->type = type;
    fedI->valid = fedValidationIdentifier;
    auto* hfed = reinterpret_cast<HelicsFederate>(fedI.get());
    getMasterHolder()->addFed(std::move(fedI));
    return (hfed);
}